

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint unfilter(uchar *out,uchar *in,uint w,uint h,uint bpp)

{
  ulong uVar1;
  byte bVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  bool bVar6;
  byte bVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uchar *puVar15;
  uint uVar16;
  long lVar17;
  uchar *puVar18;
  ulong uVar19;
  uchar *puVar20;
  uchar *puVar21;
  byte bVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  byte bVar28;
  uchar *puVar29;
  byte bVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  
  if (h == 0) {
    return 0;
  }
  uVar16 = bpp + 7;
  uVar27 = (ulong)(uVar16 >> 3);
  lVar17 = (ulong)bpp * (ulong)(w >> 3);
  uVar10 = (ulong)((w & 7) * bpp + 7 >> 3);
  uVar1 = lVar17 + uVar10;
  lVar12 = uVar10 + lVar17 + 1;
  puVar18 = in + 1;
  lVar8 = -uVar27;
  lVar31 = (long)out - uVar27;
  lVar17 = -uVar27;
  lVar32 = uVar1 - uVar27;
  puVar15 = out + uVar27;
  puVar21 = in + uVar27 + 1;
  uVar33 = 0;
  puVar20 = (uchar *)0x0;
  uVar10 = lVar17 + 2U;
  puVar29 = out;
  do {
    switch(in[lVar12 * uVar33]) {
    case '\0':
      if (uVar1 != 0) {
        uVar19 = 0;
        do {
          puVar29[uVar19] = puVar18[uVar19];
          uVar19 = uVar19 + 1;
        } while (uVar1 != uVar19);
        break;
      }
LAB_001251ca:
      uVar19 = 0;
      bVar6 = true;
      goto LAB_00125833;
    case '\x01':
      if (7 < uVar16) {
        uVar19 = 0;
        do {
          puVar29[uVar19] = puVar18[uVar19];
          uVar19 = uVar19 + 1;
        } while (uVar27 != uVar19);
      }
      if (uVar1 <= uVar27) {
LAB_001251c8:
        uVar10 = uVar10 & 0xffffffff;
        goto LAB_001251ca;
      }
      lVar9 = 0;
      do {
        puVar15[lVar9] = puVar29[lVar9] + puVar21[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar32 != lVar9);
      break;
    case '\x02':
      if (puVar20 == (uchar *)0x0) {
        if (uVar1 == 0) goto LAB_001251c8;
        uVar19 = 0;
        do {
          puVar29[uVar19] = puVar18[uVar19];
          uVar19 = uVar19 + 1;
        } while (uVar1 != uVar19);
      }
      else {
        if (uVar1 == 0) {
LAB_00125777:
          uVar10 = uVar10 & 0xffffffff;
          bVar6 = true;
          uVar19 = 0;
          goto LAB_00125833;
        }
        uVar19 = 0;
        do {
          puVar29[uVar19] = puVar20[uVar19] + puVar18[uVar19];
          uVar19 = uVar19 + 1;
        } while (uVar1 != uVar19);
      }
      break;
    case '\x03':
      if (puVar20 == (uchar *)0x0) {
        if (7 < uVar16) {
          uVar19 = 0;
          do {
            puVar29[uVar19] = puVar18[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar27 != uVar19);
        }
        uVar19 = 0;
        bVar6 = true;
        if (uVar1 <= uVar27) {
          uVar10 = uVar10 & 0xffffffff;
          goto LAB_00125833;
        }
        lVar9 = 0;
        do {
          puVar15[lVar9] = (puVar29[lVar9] >> 1) + puVar21[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar32 != lVar9);
      }
      else {
        if (7 < uVar16) {
          uVar19 = 0;
          do {
            puVar29[uVar19] = (puVar20[uVar19] >> 1) + puVar18[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar27 != uVar19);
        }
        if (uVar1 <= uVar27) goto LAB_00125777;
        lVar9 = 0;
        do {
          puVar15[lVar9] =
               (char)((uint)puVar20[lVar9 + uVar27] + (uint)puVar29[lVar9] >> 1) + puVar21[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar32 != lVar9);
      }
      break;
    case '\x04':
      if (puVar20 == (uchar *)0x0) {
        if (7 < uVar16) {
          uVar19 = 0;
          do {
            puVar29[uVar19] = puVar18[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar27 != uVar19);
        }
        if (uVar1 <= uVar27) goto LAB_001251c8;
        lVar9 = 0;
        do {
          puVar15[lVar9] = puVar29[lVar9] + puVar21[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar32 != lVar9);
      }
      else {
        if (uVar16 < 8) {
          uVar13 = 0;
        }
        else {
          uVar19 = 0;
          do {
            puVar29[uVar19] = puVar20[uVar19] + puVar18[uVar19];
            uVar19 = uVar19 + 1;
            uVar13 = uVar27;
          } while (uVar27 != uVar19);
        }
        if (uVar16 < 0x20) {
          if (uVar16 >> 3 == 3) {
            uVar19 = uVar13 + 2;
            while (uVar19 < uVar1) {
              bVar28 = *(byte *)(lVar31 + uVar13);
              bVar11 = *(byte *)(lVar31 + 1 + uVar13);
              bVar23 = puVar20[uVar13];
              bVar22 = puVar20[uVar13 + 1];
              bVar7 = puVar20[uVar13 + lVar17];
              uVar24 = (uint)bVar23 - (uint)bVar7;
              uVar14 = -uVar24;
              if (0 < (int)uVar24) {
                uVar14 = uVar24;
              }
              uVar14 = uVar14 & 0xff;
              uVar25 = (uint)bVar28 - (uint)bVar7;
              uVar24 = -uVar25;
              if (0 < (int)uVar25) {
                uVar24 = uVar25;
              }
              uVar26 = (uint)bVar23 + (uint)bVar28 + (uint)bVar7 * -2;
              uVar25 = -uVar26;
              if (0 < (int)uVar26) {
                uVar25 = uVar26;
              }
              bVar30 = puVar20[uVar13 + 2];
              if ((uVar24 & 0xff) < uVar14) {
                bVar28 = bVar23;
                uVar14 = uVar24 & 0xff;
              }
              bVar23 = puVar20[uVar13 + lVar17 + 1];
              if (uVar25 < uVar14) {
                bVar28 = bVar7;
              }
              uVar24 = (uint)bVar22 - (uint)bVar23;
              uVar14 = -uVar24;
              if (0 < (int)uVar24) {
                uVar14 = uVar24;
              }
              uVar14 = uVar14 & 0xff;
              uVar25 = (uint)bVar11 - (uint)bVar23;
              uVar24 = -uVar25;
              if (0 < (int)uVar25) {
                uVar24 = uVar25;
              }
              uVar26 = (uint)bVar22 + (uint)bVar11 + (uint)bVar23 * -2;
              uVar25 = -uVar26;
              if (0 < (int)uVar26) {
                uVar25 = uVar26;
              }
              if ((uVar24 & 0xff) < uVar14) {
                bVar11 = bVar22;
                uVar14 = uVar24 & 0xff;
              }
              bVar22 = puVar20[uVar13 + lVar17 + 2U];
              if (uVar25 < uVar14) {
                bVar11 = bVar23;
              }
              uVar3 = puVar18[uVar13 + 1];
              uVar24 = (uint)bVar30 - (uint)bVar22;
              uVar14 = -uVar24;
              if (0 < (int)uVar24) {
                uVar14 = uVar24;
              }
              bVar23 = *(byte *)(lVar31 + 2 + uVar13);
              uVar14 = uVar14 & 0xff;
              uVar25 = (uint)bVar23 - (uint)bVar22;
              uVar24 = -uVar25;
              if (0 < (int)uVar25) {
                uVar24 = uVar25;
              }
              uVar26 = (uint)bVar30 + (uint)bVar23 + (uint)bVar22 * -2;
              uVar25 = -uVar26;
              if (0 < (int)uVar26) {
                uVar25 = uVar26;
              }
              if ((uVar24 & 0xff) < uVar14) {
                uVar14 = uVar24 & 0xff;
                bVar23 = bVar30;
              }
              if (uVar25 < uVar14) {
                bVar23 = bVar22;
              }
              uVar4 = puVar18[uVar13 + 2];
              puVar29[uVar13] = bVar28 + puVar18[uVar13];
              puVar29[uVar13 + 1] = bVar11 + uVar3;
              puVar29[uVar13 + 2] = bVar23 + uVar4;
              uVar19 = uVar13 + 5;
              uVar13 = uVar13 + 3;
            }
          }
          else if ((0xf < uVar16) && (uVar19 = uVar13 + 1, uVar13 + 1 < uVar1)) {
            do {
              uVar13 = uVar19;
              bVar28 = *(byte *)(lVar31 + -1 + uVar13);
              bVar11 = puVar20[uVar13 - 1];
              bVar23 = puVar20[uVar13];
              bVar22 = puVar20[uVar13 + lVar8 + -1];
              uVar24 = (uint)bVar11 - (uint)bVar22;
              uVar14 = -uVar24;
              if (0 < (int)uVar24) {
                uVar14 = uVar24;
              }
              uVar14 = uVar14 & 0xff;
              uVar25 = (uint)bVar28 - (uint)bVar22;
              uVar24 = -uVar25;
              if (0 < (int)uVar25) {
                uVar24 = uVar25;
              }
              uVar26 = (uint)bVar11 + (uint)bVar28 + (uint)bVar22 * -2;
              uVar25 = -uVar26;
              if (0 < (int)uVar26) {
                uVar25 = uVar26;
              }
              if ((uVar24 & 0xff) < uVar14) {
                bVar28 = bVar11;
                uVar14 = uVar24 & 0xff;
              }
              bVar11 = puVar20[uVar13 + lVar8];
              if (uVar25 < uVar14) {
                bVar28 = bVar22;
              }
              uVar24 = (uint)bVar23 - (uint)bVar11;
              uVar14 = -uVar24;
              if (0 < (int)uVar24) {
                uVar14 = uVar24;
              }
              bVar22 = *(byte *)(lVar31 + uVar13);
              uVar14 = uVar14 & 0xff;
              uVar25 = (uint)bVar22 - (uint)bVar11;
              uVar24 = -uVar25;
              if (0 < (int)uVar25) {
                uVar24 = uVar25;
              }
              uVar26 = (uint)bVar23 + (uint)bVar22 + (uint)bVar11 * -2;
              uVar25 = -uVar26;
              if (0 < (int)uVar26) {
                uVar25 = uVar26;
              }
              if ((uVar24 & 0xff) < uVar14) {
                bVar22 = bVar23;
                uVar14 = uVar24 & 0xff;
              }
              if (uVar25 < uVar14) {
                bVar22 = bVar11;
              }
              uVar3 = puVar18[uVar13];
              puVar29[uVar13 - 1] = bVar28 + puVar18[uVar13 - 1];
              puVar29[uVar13] = bVar22 + uVar3;
              uVar19 = uVar13 + 2;
            } while (uVar13 + 2 < uVar1);
            goto LAB_0012572e;
          }
        }
        else {
          uVar19 = uVar13 + 3;
          if (uVar13 + 3 < uVar1) {
            do {
              uVar13 = uVar19;
              bVar28 = *(byte *)(lVar31 + -3 + uVar13);
              bVar11 = *(byte *)(lVar31 + -2 + uVar13);
              bVar23 = puVar20[uVar13 - 3];
              bVar22 = puVar20[uVar13 - 2];
              bVar7 = puVar20[uVar13 + lVar8 + -3];
              uVar24 = (uint)bVar23 - (uint)bVar7;
              uVar14 = -uVar24;
              if (0 < (int)uVar24) {
                uVar14 = uVar24;
              }
              uVar14 = uVar14 & 0xff;
              uVar25 = (uint)bVar28 - (uint)bVar7;
              uVar24 = -uVar25;
              if (0 < (int)uVar25) {
                uVar24 = uVar25;
              }
              uVar26 = (uint)bVar23 + (uint)bVar28 + (uint)bVar7 * -2;
              uVar25 = -uVar26;
              if (0 < (int)uVar26) {
                uVar25 = uVar26;
              }
              if ((uVar24 & 0xff) < uVar14) {
                uVar14 = uVar24 & 0xff;
                bVar28 = bVar23;
              }
              bVar23 = puVar20[uVar13 + lVar8 + -2];
              if (uVar25 < uVar14) {
                bVar28 = bVar7;
              }
              uVar24 = (uint)bVar22 - (uint)bVar23;
              uVar14 = -uVar24;
              if (0 < (int)uVar24) {
                uVar14 = uVar24;
              }
              bVar7 = *(byte *)(lVar31 + -1 + uVar13);
              uVar14 = uVar14 & 0xff;
              uVar25 = (uint)bVar11 - (uint)bVar23;
              uVar24 = -uVar25;
              if (0 < (int)uVar25) {
                uVar24 = uVar25;
              }
              uVar24 = uVar24 & 0xff;
              uVar26 = (uint)bVar22 + (uint)bVar11 + (uint)bVar23 * -2;
              uVar25 = -uVar26;
              if (0 < (int)uVar26) {
                uVar25 = uVar26;
              }
              bVar30 = *(byte *)(lVar31 + uVar13);
              uVar26 = uVar24;
              if (uVar14 <= uVar24) {
                uVar26 = uVar14;
              }
              bVar2 = puVar20[uVar13 - 1];
              if (uVar14 > uVar24) {
                bVar11 = bVar22;
              }
              if (uVar25 < uVar26) {
                bVar11 = bVar23;
              }
              uVar3 = puVar18[uVar13 - 2];
              bVar23 = puVar20[uVar13 + lVar8 + -1];
              uVar24 = (uint)bVar2 - (uint)bVar23;
              uVar14 = -uVar24;
              if (0 < (int)uVar24) {
                uVar14 = uVar24;
              }
              uVar14 = uVar14 & 0xff;
              uVar25 = (uint)bVar7 - (uint)bVar23;
              uVar24 = -uVar25;
              if (0 < (int)uVar25) {
                uVar24 = uVar25;
              }
              uVar26 = (uint)bVar7 + (uint)bVar2 + (uint)bVar23 * -2;
              uVar25 = -uVar26;
              if (0 < (int)uVar26) {
                uVar25 = uVar26;
              }
              bVar22 = puVar20[uVar13];
              if ((uVar24 & 0xff) < uVar14) {
                bVar7 = bVar2;
                uVar14 = uVar24 & 0xff;
              }
              bVar2 = puVar20[uVar13 + lVar8];
              if (uVar25 < uVar14) {
                bVar7 = bVar23;
              }
              uVar4 = puVar18[uVar13 - 1];
              uVar24 = (uint)bVar22 - (uint)bVar2;
              uVar14 = -uVar24;
              if (0 < (int)uVar24) {
                uVar14 = uVar24;
              }
              uVar14 = uVar14 & 0xff;
              uVar25 = (uint)bVar30 - (uint)bVar2;
              uVar24 = -uVar25;
              if (0 < (int)uVar25) {
                uVar24 = uVar25;
              }
              uVar26 = (uint)bVar22 + (uint)bVar30 + (uint)bVar2 * -2;
              uVar25 = -uVar26;
              if (0 < (int)uVar26) {
                uVar25 = uVar26;
              }
              if ((uVar24 & 0xff) < uVar14) {
                bVar30 = bVar22;
                uVar14 = uVar24 & 0xff;
              }
              if (uVar25 < uVar14) {
                bVar30 = bVar2;
              }
              uVar5 = puVar18[uVar13];
              puVar29[uVar13 - 3] = bVar28 + puVar18[uVar13 - 3];
              puVar29[uVar13 - 2] = bVar11 + uVar3;
              puVar29[uVar13 - 1] = bVar7 + uVar4;
              puVar29[uVar13] = bVar30 + uVar5;
              uVar19 = uVar13 + 4;
            } while (uVar13 + 4 < uVar1);
LAB_0012572e:
            uVar13 = uVar13 + 1;
          }
        }
        if (uVar13 == uVar1) goto LAB_00125777;
        do {
          bVar28 = puVar20[uVar13];
          bVar11 = puVar20[uVar13 + lVar8];
          uVar24 = (uint)bVar28 - (uint)bVar11;
          uVar14 = -uVar24;
          if (0 < (int)uVar24) {
            uVar14 = uVar24;
          }
          bVar23 = *(byte *)(lVar31 + uVar13);
          uVar14 = uVar14 & 0xff;
          uVar25 = (uint)bVar23 - (uint)bVar11;
          uVar24 = -uVar25;
          if (0 < (int)uVar25) {
            uVar24 = uVar25;
          }
          uVar26 = (uint)bVar28 + (uint)bVar23 + (uint)bVar11 * -2;
          uVar25 = -uVar26;
          if (0 < (int)uVar26) {
            uVar25 = uVar26;
          }
          if ((uVar24 & 0xff) < uVar14) {
            bVar23 = bVar28;
            uVar14 = uVar24 & 0xff;
          }
          if (uVar25 < uVar14) {
            bVar23 = bVar11;
          }
          puVar29[uVar13] = bVar23 + puVar18[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar1 != uVar13);
      }
      break;
    default:
      bVar6 = false;
      uVar19 = 0x24;
      goto LAB_00125833;
    }
    uVar10 = uVar10 & 0xffffffff;
    uVar19 = 0;
    bVar6 = true;
LAB_00125833:
    uVar10 = uVar10 & 0xffffffff;
    if (!bVar6) {
      uVar10 = uVar19;
    }
    if (!bVar6) {
      return (uint)uVar10;
    }
    puVar20 = out + uVar1 * uVar33;
    uVar33 = uVar33 + 1;
    puVar29 = puVar29 + uVar1;
    puVar18 = puVar18 + lVar12;
    lVar31 = lVar31 + uVar1;
    puVar15 = puVar15 + uVar1;
    puVar21 = puVar21 + lVar12;
    if (uVar33 == h) {
      return 0;
    }
  } while( true );
}

Assistant:

static unsigned unfilter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h, unsigned bpp) {
  /*
  For PNG filter method 0
  this function unfilters a single image (e.g. without interlacing this is called once, with Adam7 seven times)
  out must have enough bytes allocated already, in must have the scanlines + 1 filtertype byte per scanline
  w and h are image dimensions or dimensions of reduced image, bpp is bits per pixel
  in and out are allowed to be the same memory address (but aren't the same size since in has the extra filter bytes)
  */

  unsigned y;
  unsigned char* prevline = 0;

  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = lodepng_get_raw_size_idat(w, 1, bpp) - 1u;

  for(y = 0; y < h; ++y) {
    size_t outindex = linebytes * y;
    size_t inindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
    unsigned char filterType = in[inindex];

    CERROR_TRY_RETURN(unfilterScanline(&out[outindex], &in[inindex + 1], prevline, bytewidth, filterType, linebytes));

    prevline = &out[outindex];
  }

  return 0;
}